

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldOptions::InternalSerializeWithCachedSizesToArray
          (FieldOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint8 *puVar4;
  uint8 *in_RSI;
  FieldOptions *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffdc8;
  uint local_220;
  uint8 *local_210;
  EpsCopyOutputStream *in_stack_fffffffffffffe08;
  EpsCopyOutputStream *in_stack_fffffffffffffe10;
  UninterpretedOption *in_stack_fffffffffffffe18;
  EpsCopyOutputStream *stream_00;
  int in_stack_fffffffffffffe20;
  int start_field_number;
  ExtensionSet *this_00;
  
  this_00 = (ExtensionSet *)&in_RDI->_has_bits_;
  start_field_number = 0;
  uVar3 = ((HasBits<1UL> *)this_00)->has_bits_[0];
  local_210 = in_RSI;
  if ((uVar3 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    _internal_ctype(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RSI);
    local_210 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_RDI >> 0x20),(uint8 *)in_stack_fffffffffffffdc8);
  }
  if ((uVar3 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    bVar1 = _internal_packed(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    local_210 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  if ((uVar3 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    bVar1 = _internal_deprecated(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    local_210 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  if ((uVar3 & 4) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    bVar1 = _internal_lazy(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    local_210 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  if ((uVar3 & 0x20) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    _internal_jstype(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(6,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    local_210 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_RDI >> 0x20),(uint8 *)in_stack_fffffffffffffdc8);
  }
  if ((uVar3 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    bVar1 = _internal_weak(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    local_210 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  local_220 = 0;
  uVar3 = _internal_uninterpreted_option_size((FieldOptions *)0x692fb4);
  for (; local_220 < uVar3; local_220 = local_220 + 1) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffdc8);
    _internal_uninterpreted_option(in_RDI,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    uVar2 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_210);
    uVar2 = UninterpretedOption::GetCachedSize((UninterpretedOption *)0x69307f);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar4);
    local_210 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffe18,(uint8 *)in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08);
  }
  local_210 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                        (this_00,start_field_number,in_stack_fffffffffffffe20,
                         (uint8 *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)stream_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_210 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)this_00,
                           (uint8 *)CONCAT44(start_field_number,in_stack_fffffffffffffe20),stream_00
                          );
  }
  return local_210;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FieldOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_ctype(), target);
  }

  // optional bool packed = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      6, this->_internal_jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}